

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.cpp
# Opt level: O2

void __thiscall gui::TextBoxStyle::TextBoxStyle(TextBoxStyle *this,Gui *gui)

{
  Vector2f local_28;
  
  Style::Style(&this->super_Style,gui);
  (this->super_Style)._vptr_Style = (_func_int **)&PTR__TextBoxStyle_0026fab0;
  local_28.x = 0.0;
  local_28.y = 0.0;
  sf::RectangleShape::RectangleShape(&this->box_,&local_28);
  local_28.x = 0.0;
  local_28.y = 0.0;
  sf::RectangleShape::RectangleShape(&this->caret_,&local_28);
  sf::Text::Text(&this->text_);
  sf::Color::Color(&this->boxColor_);
  sf::Color::Color(&this->readOnlyBoxColor_);
  sf::Color::Color(&this->textColor_);
  sf::Color::Color(&this->defaultTextColor_);
  (this->textPadding_).x = 0.0;
  (this->textPadding_).y = 0.0;
  (this->textPadding_).z = 0.0;
  return;
}

Assistant:

TextBoxStyle::TextBoxStyle(const Gui& gui) :
    Style(gui) {
}